

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O3

shared_ptr<celero::Benchmark> __thiscall celero::TestVector::operator[](TestVector *this,size_t x)

{
  int *piVar1;
  pthread_mutex_t *__mutex;
  _Head_base<0UL,_celero::TestVector::Impl_*,_false> _Var2;
  shared_ptr<celero::Benchmark> *psVar3;
  _Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_> _Var4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_01;
  long lVar9;
  long *plVar10;
  element_type *peVar11;
  __normal_iterator<std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  __it;
  __normal_iterator<std::shared_ptr<celero::Benchmark>_*,_std::vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>_>
  _Var12;
  long lVar13;
  shared_ptr<celero::Benchmark> sVar14;
  shared_ptr<celero::Benchmark> sVar15;
  long *plStack_e8;
  long lStack_e0;
  long alStack_d8 [2];
  pthread_mutex_t *ppStack_c8;
  shared_ptr<celero::Benchmark> *psStack_c0;
  long *plStack_b8;
  long lStack_b0;
  long alStack_a8 [2];
  long *plStack_98;
  long lStack_90;
  long alStack_88 [2];
  long *plStack_78;
  long lStack_70;
  long alStack_68 [2];
  TestVector *pTStack_58;
  size_t sStack_50;
  
  __mutex = *(pthread_mutex_t **)x;
  plVar10 = (long *)x;
  uVar6 = pthread_mutex_lock(__mutex);
  if (uVar6 == 0) {
    lVar13 = *(long *)(*(long *)x + 0x28);
    (this->pimpl)._pimpl._M_t.
    super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
    .super__Head_base<0UL,_celero::TestVector::Impl_*,_false> =
         (_Head_base<0UL,_celero::TestVector::Impl_*,_false>)
         ((_Head_base<0UL,_celero::TestVector::Impl_*,_false> *)(lVar13 + in_RDX * 0x10))->
         _M_head_impl;
    _Var2._M_head_impl =
         ((_Head_base<0UL,_celero::TestVector::Impl_*,_false> *)(lVar13 + 8 + in_RDX * 0x10))->
         _M_head_impl;
    this[1].pimpl._pimpl._M_t.
    super___uniq_ptr_impl<celero::TestVector::Impl,_std::default_delete<celero::TestVector::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::TestVector::Impl_*,_std::default_delete<celero::TestVector::Impl>_>
    .super__Head_base<0UL,_celero::TestVector::Impl_*,_false> =
         (_Head_base<0UL,_celero::TestVector::Impl_*,_false>)_Var2._M_head_impl;
    if (_Var2._M_head_impl != (Impl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)&(_Var2._M_head_impl)->testVectorMutex + 8);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      else {
        piVar1 = (int *)((long)&(_Var2._M_head_impl)->testVectorMutex + 8);
        *piVar1 = *piVar1 + 1;
      }
    }
    pthread_mutex_unlock(__mutex);
    sVar14.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar14.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<celero::Benchmark>)
           sVar14.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
  }
  peVar11 = (element_type *)(ulong)uVar6;
  std::__throw_system_error(uVar6);
  ppStack_c8 = (pthread_mutex_t *)*plVar10;
  pTStack_58 = this;
  sStack_50 = x;
  iVar7 = pthread_mutex_lock(ppStack_c8);
  if (iVar7 != 0) {
    uVar8 = std::__throw_system_error(iVar7);
    if (plStack_e8 != alStack_d8) {
      operator_delete(plStack_e8,alStack_d8[0] + 1);
    }
    if (plStack_78 != alStack_68) {
      operator_delete(plStack_78,alStack_68[0] + 1);
    }
    if (plStack_98 != alStack_88) {
      operator_delete(plStack_98,alStack_88[0] + 1);
    }
    if (plStack_b8 != alStack_a8) {
      operator_delete(plStack_b8,alStack_a8[0] + 1);
    }
    pthread_mutex_unlock(ppStack_c8);
    _Unwind_Resume(uVar8);
  }
  __it._M_current = *(shared_ptr<celero::Benchmark> **)(*plVar10 + 0x28);
  psVar3 = *(shared_ptr<celero::Benchmark> **)(*plVar10 + 0x30);
  plStack_b8 = alStack_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_b8,*extraout_RDX_00,extraout_RDX_00[1] + *extraout_RDX_00);
  plStack_98 = alStack_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_98,plStack_b8,lStack_b0 + (long)plStack_b8);
  plStack_e8 = alStack_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_e8,plStack_98,lStack_90 + (long)plStack_98);
  plStack_78 = alStack_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_78,plStack_e8,lStack_e0 + (long)plStack_e8);
  if (plStack_e8 != alStack_d8) {
    operator_delete(plStack_e8,alStack_d8[0] + 1);
  }
  plStack_e8 = alStack_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_e8,plStack_78,lStack_70 + (long)plStack_78);
  lVar13 = (long)psVar3 - (long)__it._M_current;
  psStack_c0 = psVar3;
  if (0 < lVar13 >> 6) {
    lVar9 = (lVar13 >> 6) + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::__0>
                          *)&plStack_e8,__it);
      _Var12._M_current = __it._M_current;
      if (bVar5) goto LAB_00134853;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::__0>
                          *)&plStack_e8,__it._M_current + 1);
      _Var12._M_current = __it._M_current + 1;
      if (bVar5) goto LAB_00134853;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::__0>
                          *)&plStack_e8,__it._M_current + 2);
      _Var12._M_current = __it._M_current + 2;
      if (bVar5) goto LAB_00134853;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::__0>
                          *)&plStack_e8,__it._M_current + 3);
      _Var12._M_current = __it._M_current + 3;
      if (bVar5) goto LAB_00134853;
      __it._M_current = __it._M_current + 4;
      lVar9 = lVar9 + -1;
      lVar13 = lVar13 + -0x40;
    } while (1 < lVar9);
  }
  psVar3 = psStack_c0;
  lVar13 = lVar13 >> 4;
  if (lVar13 != 1) {
    if (lVar13 != 2) {
      _Var12._M_current = psVar3;
      if ((lVar13 != 3) ||
         (bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::$_0>::
                  operator()((_Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::__0>
                              *)&plStack_e8,__it), _Var12._M_current = __it._M_current, bVar5))
      goto LAB_00134853;
      __it._M_current = __it._M_current + 1;
    }
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::__0>
                        *)&plStack_e8,__it);
    _Var12._M_current = __it._M_current;
    if (bVar5) goto LAB_00134853;
    __it._M_current = __it._M_current + 1;
  }
  bVar5 = __gnu_cxx::__ops::
          _Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::$_0>::operator()
                    ((_Iter_pred<celero::TestVector::operator[](std::__cxx11::string_const&)::__0> *
                     )&plStack_e8,__it);
  _Var12._M_current = psVar3;
  if (bVar5) {
    _Var12._M_current = __it._M_current;
  }
LAB_00134853:
  if (plStack_e8 != alStack_d8) {
    operator_delete(plStack_e8,alStack_d8[0] + 1);
  }
  if (plStack_78 != alStack_68) {
    operator_delete(plStack_78,alStack_68[0] + 1);
  }
  if (plStack_98 != alStack_88) {
    operator_delete(plStack_98,alStack_88[0] + 1);
  }
  if (plStack_b8 != alStack_a8) {
    operator_delete(plStack_b8,alStack_a8[0] + 1);
  }
  if (_Var12._M_current == *(shared_ptr<celero::Benchmark> **)(*plVar10 + 0x30)) {
    (peVar11->pimpl)._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)0x0;
    peVar11[1].pimpl._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)0x0;
  }
  else {
    (peVar11->pimpl)._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)
         ((_Var12._M_current)->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    _Var4.super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>._M_head_impl =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)
         ((_Var12._M_current)->super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    peVar11[1].pimpl._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         _Var4.super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>._M_head_impl;
    if (_Var4.super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>._M_head_impl != (Impl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)((long)_Var4.super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>._M_head_impl +
                8U) = *(int *)((long)_Var4.super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>.
                                     _M_head_impl + 8U) + 1;
        UNLOCK();
      }
      else {
        *(int *)((long)_Var4.super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>._M_head_impl +
                8U) = *(int *)((long)_Var4.super__Head_base<0UL,_celero::Benchmark::Impl_*,_false>.
                                     _M_head_impl + 8U) + 1;
      }
    }
  }
  pthread_mutex_unlock(ppStack_c8);
  sVar15.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX_01._M_pi;
  sVar15.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
  return (shared_ptr<celero::Benchmark>)
         sVar15.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Benchmark> TestVector::operator[](size_t x)
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	return this->pimpl->testVector[x];
}